

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O1

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  void *pvVar6;
  Allocator *pAVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  uint _c;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 *puVar18;
  ulong uVar19;
  undefined4 *puVar20;
  ulong uVar21;
  long lVar22;
  undefined4 *puVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  Mat bottom_blob_permuted;
  Mat top_blob_permuted;
  uint local_150;
  uint local_13c;
  int local_138;
  Mat local_118;
  uint local_cc;
  Mat local_c8;
  Mat local_78;
  
  sVar4 = bottom_blob->elemsize;
  uVar1 = bottom_blob->w;
  uVar25 = bottom_blob->h;
  uVar11._0_4_ = bottom_blob->h;
  uVar11._4_4_ = bottom_blob->d;
  uVar2 = bottom_blob->c;
  uVar24 = bottom_blob->d * uVar2 * uVar25 * uVar1;
  iVar14 = bottom_blob->dims;
  uVar10._0_4_ = bottom_blob->dims;
  uVar10._4_4_ = bottom_blob->w;
  local_150 = this->w;
  uVar13 = this->h;
  local_13c = this->d;
  uVar17 = (ulong)local_13c;
  _c = this->c;
  iVar3 = this->ndim;
  if (iVar3 == 1) {
    if (local_150 == 0) {
      local_150 = uVar1;
    }
    if (local_150 == 0xffffffff) {
      local_150 = uVar24;
    }
    if ((iVar14 == 1) && (uVar1 == local_150)) goto LAB_0020f60e;
  }
  if (iVar3 == 2) {
    if (local_150 == 0) {
      local_150 = uVar1;
    }
    if (uVar13 == 0) {
      uVar13 = uVar25;
    }
    if (local_150 == 0xffffffff) {
      local_150 = (int)uVar24 / (int)uVar13;
      uVar17 = (long)(int)uVar24 % (long)(int)uVar13 & 0xffffffff;
    }
    if (uVar13 == 0xffffffff) {
      uVar13 = (int)uVar24 / (int)local_150;
      uVar17 = (long)(int)uVar24 % (long)(int)local_150 & 0xffffffff;
    }
    if ((iVar14 == 2) && (uVar25 == uVar13)) {
LAB_0020f60e:
      if (top_blob != bottom_blob) {
        piVar5 = bottom_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar5 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar5;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar14 = bottom_blob->w;
        iVar3 = bottom_blob->h;
        iVar12 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar14;
        top_blob->h = iVar3;
        top_blob->d = iVar12;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
        return 0;
      }
      return 0;
    }
  }
  if (iVar3 == 3) {
    if (local_150 == 0) {
      local_150 = uVar1;
    }
    if (uVar13 == 0) {
      uVar13 = uVar25;
    }
    if (_c == 0) {
      _c = uVar2;
    }
    if (local_150 == 0xffffffff) {
      uVar19 = (ulong)(uint)((int)((long)(int)uVar24 / (long)(int)_c) >> 0x1f) << 0x20 |
               (long)(int)uVar24 / (long)(int)_c & 0xffffffffU;
      uVar17 = (long)uVar19 % (long)(int)uVar13 & 0xffffffff;
      local_150 = (uint)((long)uVar19 / (long)(int)uVar13);
    }
    if (uVar13 == 0xffffffff) {
      uVar19 = (ulong)(uint)((int)((long)(int)uVar24 / (long)(int)_c) >> 0x1f) << 0x20 |
               (long)(int)uVar24 / (long)(int)_c & 0xffffffffU;
      uVar17 = (long)uVar19 % (long)(int)local_150 & 0xffffffff;
      uVar13 = (uint)((long)uVar19 / (long)(int)local_150);
    }
    if (_c == 0xffffffff) {
      uVar19 = (ulong)(uint)((int)((long)(int)uVar24 / (long)(int)uVar13) >> 0x1f) << 0x20 |
               (long)(int)uVar24 / (long)(int)uVar13 & 0xffffffffU;
      uVar17 = (long)uVar19 % (long)(int)local_150 & 0xffffffff;
      _c = (uint)((long)uVar19 / (long)(int)local_150);
    }
    if ((iVar14 == 3) && (uVar2 == _c)) {
      if (top_blob != bottom_blob) {
        piVar5 = bottom_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar5 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar5;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar14 = bottom_blob->w;
        iVar3 = bottom_blob->h;
        iVar12 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar14;
        top_blob->h = iVar3;
        top_blob->d = iVar12;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
      top_blob->w = local_150;
      top_blob->h = uVar13;
      return 0;
    }
  }
  if (iVar3 == 4) {
    if (local_150 == 0) {
      local_150 = uVar1;
    }
    if (uVar13 == 0) {
      uVar13 = uVar25;
    }
    if (_c == 0) {
      _c = uVar2;
    }
    if (local_13c == 0) {
      local_13c = bottom_blob->d;
    }
    if (local_150 == 0xffffffff) {
      uVar17 = (long)((ulong)(uint)((int)((long)(int)uVar24 / (long)(int)_c) >> 0x1f) << 0x20 |
                     (long)(int)uVar24 / (long)(int)_c & 0xffffffffU) / (long)(int)local_13c;
      uVar19 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
      uVar17 = (long)uVar19 % (long)(int)uVar13 & 0xffffffff;
      local_150 = (uint)((long)uVar19 / (long)(int)uVar13);
    }
    if (uVar13 == 0xffffffff) {
      uVar17 = (long)((ulong)(uint)((int)((long)(int)uVar24 / (long)(int)_c) >> 0x1f) << 0x20 |
                     (long)(int)uVar24 / (long)(int)_c & 0xffffffffU) / (long)(int)local_13c;
      uVar19 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
      uVar17 = (long)uVar19 % (long)(int)local_150 & 0xffffffff;
      uVar13 = (uint)((long)uVar19 / (long)(int)local_150);
    }
    if (local_13c == 0xffffffff) {
      uVar17 = (long)((ulong)(uint)((int)((long)(int)uVar24 / (long)(int)_c) >> 0x1f) << 0x20 |
                     (long)(int)uVar24 / (long)(int)_c & 0xffffffffU) / (long)(int)uVar13;
      uVar19 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
      uVar17 = (long)uVar19 % (long)(int)local_150 & 0xffffffff;
      local_13c = (uint)((long)uVar19 / (long)(int)local_150);
    }
    if (_c == 0xffffffff) {
      uVar17 = (long)((ulong)(uint)((int)((long)(int)uVar24 / (long)(int)local_13c) >> 0x1f) << 0x20
                     | (long)(int)uVar24 / (long)(int)local_13c & 0xffffffffU) / (long)(int)uVar13;
      uVar19 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
      uVar17 = (long)uVar19 % (long)(int)local_150 & 0xffffffff;
      _c = (uint)((long)uVar19 / (long)(int)local_150);
    }
    if ((iVar14 == 4) && (uVar2 == _c)) {
      if (top_blob != bottom_blob) {
        piVar5 = bottom_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pvVar6 = top_blob->data;
            pAVar7 = top_blob->allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar6,uVar17);
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar5 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar5;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar14 = bottom_blob->w;
        iVar3 = bottom_blob->h;
        iVar12 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar14;
        top_blob->h = iVar3;
        top_blob->d = iVar12;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
      top_blob->w = local_150;
      top_blob->h = uVar13;
      top_blob->d = local_13c;
      return 0;
    }
  }
  if ((((iVar14 == 4 && iVar3 == 4 || iVar14 == 3 && iVar3 == 3) && uVar2 == _c) ||
      (uVar25 == uVar13 && (iVar14 == 2 && iVar3 == 2))) || (this->permute != 1)) {
    if (iVar3 == 1) {
      Mat::reshape(&local_118,bottom_blob,local_150,opt->blob_allocator);
      if (&local_118 != top_blob) {
        piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_118.data;
        top_blob->refcount = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        top_blob->elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
        top_blob->elempack = local_118.elempack;
        top_blob->allocator = local_118.allocator;
        top_blob->dims = local_118.dims;
        top_blob->w = local_118.w;
        top_blob->h = local_118.h;
        top_blob->d = local_118.d;
        top_blob->c = local_118.c;
        top_blob->cstep = local_118.cstep;
      }
      piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->ndim == 2) {
      Mat::reshape(&local_118,bottom_blob,local_150,uVar13,opt->blob_allocator);
      if (&local_118 != top_blob) {
        piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_118.data;
        top_blob->refcount = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        top_blob->elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
        top_blob->elempack = local_118.elempack;
        top_blob->allocator = local_118.allocator;
        top_blob->dims = local_118.dims;
        top_blob->w = local_118.w;
        top_blob->h = local_118.h;
        top_blob->d = local_118.d;
        top_blob->c = local_118.c;
        top_blob->cstep = local_118.cstep;
      }
      piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->ndim == 3) {
      Mat::reshape(&local_118,bottom_blob,local_150,uVar13,_c,opt->blob_allocator);
      if (&local_118 != top_blob) {
        piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_118.data;
        top_blob->refcount = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        top_blob->elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
        top_blob->elempack = local_118.elempack;
        top_blob->allocator = local_118.allocator;
        top_blob->dims = local_118.dims;
        top_blob->w = local_118.w;
        top_blob->h = local_118.h;
        top_blob->d = local_118.d;
        top_blob->c = local_118.c;
        top_blob->cstep = local_118.cstep;
      }
      piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->ndim == 4) {
      Mat::reshape(&local_118,bottom_blob,local_150,uVar13,local_13c,_c,opt->blob_allocator);
      if (&local_118 != top_blob) {
        piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_118.data;
        top_blob->refcount = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        top_blob->elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
        top_blob->elempack = local_118.elempack;
        top_blob->allocator = local_118.allocator;
        top_blob->dims = local_118.dims;
        top_blob->w = local_118.w;
        top_blob->h = local_118.h;
        top_blob->d = local_118.d;
        top_blob->c = local_118.c;
        top_blob->cstep = local_118.cstep;
      }
      piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep != 0) {
      return 0;
    }
    return -100;
  }
  local_118.data = bottom_blob->data;
  piVar5 = bottom_blob->refcount;
  local_118.refcount._0_4_ = SUB84(piVar5,0);
  local_118.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
  local_118.elemsize._0_4_ = (undefined4)sVar4;
  local_118.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
  local_118.elempack = bottom_blob->elempack;
  local_118.allocator = bottom_blob->allocator;
  local_118.cstep = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  local_118._40_8_ = uVar10;
  local_118._48_8_ = uVar11;
  local_118.c = uVar2;
  if (iVar14 == 2) {
    uVar1 = bottom_blob->w;
    uVar25 = bottom_blob->h;
    Mat::create(&local_118,uVar25,uVar1,sVar4,opt->workspace_allocator);
    local_138 = -100;
    if ((undefined4 *)local_118.data == (undefined4 *)0x0 ||
        (long)local_118.c * local_118.cstep == 0) goto LAB_0021064c;
    if (0 < (int)uVar1) {
      puVar18 = (undefined4 *)bottom_blob->data;
      uVar17 = 0;
      puVar20 = (undefined4 *)local_118.data;
      do {
        uVar19 = (ulong)uVar25;
        puVar23 = puVar18;
        if (0 < (int)uVar25) {
          do {
            *puVar20 = *puVar23;
            puVar20 = puVar20 + 1;
            puVar23 = puVar23 + uVar1;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
        }
        uVar17 = uVar17 + 1;
        puVar18 = puVar18 + 1;
      } while (uVar17 != uVar1);
    }
  }
  local_cc = uVar13;
  if (iVar14 == 3) {
    uVar1 = bottom_blob->w;
    uVar25 = bottom_blob->h;
    uVar2 = bottom_blob->c;
    Mat::create(&local_118,uVar2,uVar1,uVar25,sVar4,opt->workspace_allocator);
    bVar27 = (long)local_118.c * local_118.cstep == 0;
    local_138 = -100;
    if ((undefined4 *)local_118.data == (undefined4 *)0x0 || bVar27) goto LAB_0021064c;
    if (0 < (int)uVar25) {
      uVar17 = 0;
      do {
        if (0 < (int)uVar1) {
          puVar18 = (undefined4 *)
                    (local_118.cstep *
                     CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) * uVar17 +
                    (long)local_118.data);
          iVar3 = bottom_blob->w;
          lVar22 = 0;
          uVar19 = 0;
          do {
            if (0 < (int)uVar2) {
              sVar8 = bottom_blob->elemsize;
              puVar20 = (undefined4 *)
                        ((long)iVar3 * uVar17 * sVar8 + lVar22 + (long)bottom_blob->data);
              sVar9 = bottom_blob->cstep;
              uVar26 = (ulong)uVar2;
              do {
                *puVar18 = *puVar20;
                puVar18 = puVar18 + 1;
                puVar20 = (undefined4 *)((long)puVar20 + sVar8 * sVar9);
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
            }
            uVar19 = uVar19 + 1;
            lVar22 = lVar22 + 4;
          } while (uVar19 != uVar1);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar25);
    }
    local_138 = -100;
    if ((undefined4 *)local_118.data == (undefined4 *)0x0 || bVar27) goto LAB_0021064c;
  }
  if (iVar14 == 4) {
    uVar1 = bottom_blob->w;
    uVar25 = bottom_blob->h;
    uVar2 = bottom_blob->d;
    uVar13 = bottom_blob->c;
    Mat::create(&local_118,uVar13,uVar1,uVar25,uVar2,sVar4,opt->workspace_allocator);
    bVar27 = (long)local_118.c * local_118.cstep == 0;
    local_138 = -100;
    if ((undefined4 *)local_118.data == (undefined4 *)0x0 || bVar27) goto LAB_0021064c;
    if (0 < (int)uVar2) {
      uVar17 = 0;
      do {
        if (0 < (int)uVar25) {
          puVar18 = (undefined4 *)
                    (local_118.cstep *
                     CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) * uVar17 +
                    (long)local_118.data);
          uVar19 = 0;
          do {
            if (0 < (int)uVar1) {
              sVar8 = bottom_blob->elemsize;
              puVar20 = (undefined4 *)
                        ((long)bottom_blob->w * sVar8 * ((long)bottom_blob->h * uVar17 + uVar19) +
                        (long)bottom_blob->data);
              sVar9 = bottom_blob->cstep;
              uVar26 = 0;
              do {
                uVar16 = (ulong)uVar13;
                puVar23 = puVar20;
                if (0 < (int)uVar13) {
                  do {
                    *puVar18 = *puVar23;
                    puVar18 = puVar18 + 1;
                    puVar23 = (undefined4 *)((long)puVar23 + sVar8 * sVar9);
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                }
                uVar26 = uVar26 + 1;
                puVar20 = puVar20 + 1;
              } while (uVar26 != uVar1);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar25);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar2);
    }
    local_138 = -100;
    if ((undefined4 *)local_118.data == (undefined4 *)0x0 || bVar27) goto LAB_0021064c;
  }
  uVar1 = local_cc;
  if (this->ndim == 1) {
    Mat::reshape(&local_c8,&local_118,local_150,opt->blob_allocator);
    Mat::operator=(top_blob,&local_c8);
    Mat::~Mat(&local_c8);
    if (top_blob->data == (void *)0x0) {
      local_138 = -100;
    }
    else {
      local_138 = -100;
      if ((long)top_blob->c * top_blob->cstep != 0) {
        local_138 = 0;
      }
    }
    goto LAB_0021064c;
  }
  local_c8.cstep = 0;
  local_c8.data = (undefined4 *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  if (this->ndim == 2) {
    Mat::reshape(&local_78,&local_118,local_cc,local_150,opt->workspace_allocator);
    Mat::operator=(&local_c8,&local_78);
    Mat::~Mat(&local_78);
  }
  if (this->ndim == 3) {
    Mat::reshape(&local_78,&local_118,_c,local_150,uVar1,opt->workspace_allocator);
    Mat::operator=(&local_c8,&local_78);
    Mat::~Mat(&local_78);
  }
  if (this->ndim == 4) {
    Mat::reshape(&local_78,&local_118,_c,local_150,uVar1,local_13c,opt->workspace_allocator);
    Mat::operator=(&local_c8,&local_78);
    Mat::~Mat(&local_78);
  }
  if ((undefined4 *)local_c8.data == (undefined4 *)0x0) {
    local_138 = -100;
  }
  else {
    local_138 = -100;
    if ((long)local_c8.c * local_c8.cstep != 0) {
      if (this->ndim == 2) {
        Mat::create(top_blob,local_150,uVar1,sVar4,opt->blob_allocator);
        puVar18 = (undefined4 *)top_blob->data;
        if ((puVar18 == (undefined4 *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_0021063a;
        if (0 < (int)uVar1) {
          uVar17 = 0;
          puVar20 = (undefined4 *)local_c8.data;
          do {
            uVar19 = (ulong)local_150;
            puVar23 = puVar20;
            if (0 < (int)local_150) {
              do {
                *puVar18 = *puVar23;
                puVar18 = puVar18 + 1;
                puVar23 = puVar23 + uVar1;
                uVar19 = uVar19 - 1;
              } while (uVar19 != 0);
            }
            uVar17 = uVar17 + 1;
            puVar20 = puVar20 + 1;
          } while (uVar17 != uVar1);
        }
      }
      uVar25 = uVar1;
      if (this->ndim == 3) {
        Mat::create(top_blob,local_150,uVar1,_c,sVar4,opt->blob_allocator);
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_0021063a;
        if (0 < (int)_c) {
          pvVar6 = top_blob->data;
          sVar8 = top_blob->cstep;
          sVar9 = top_blob->elemsize;
          lVar22 = 0;
          uVar17 = 0;
          do {
            if (0 < (int)uVar25) {
              puVar18 = (undefined4 *)(sVar8 * sVar9 * uVar17 + (long)pvVar6);
              puVar20 = (undefined4 *)((long)local_c8.data + lVar22);
              uVar19 = 0;
              do {
                puVar23 = puVar20;
                uVar26 = (ulong)local_150;
                if (0 < (int)local_150) {
                  do {
                    *puVar18 = *puVar23;
                    puVar18 = puVar18 + 1;
                    puVar23 = puVar23 + _c;
                    uVar26 = uVar26 - 1;
                  } while (uVar26 != 0);
                }
                uVar19 = uVar19 + 1;
                puVar20 = (undefined4 *)
                          ((long)puVar20 +
                          local_c8.cstep *
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
              } while (uVar19 != uVar1);
            }
            uVar17 = uVar17 + 1;
            lVar22 = lVar22 + 4;
            uVar25 = local_cc;
          } while (uVar17 != _c);
        }
      }
      if (this->ndim == 4) {
        Mat::create(top_blob,local_150,uVar25,local_13c,_c,sVar4,opt->blob_allocator);
        if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
           (local_138 = 0, 0 < (int)_c)) {
          pvVar6 = top_blob->data;
          sVar4 = top_blob->cstep;
          sVar8 = top_blob->elemsize;
          uVar17 = (ulong)uVar25;
          uVar19 = 0;
          do {
            if (0 < (int)local_13c) {
              puVar18 = (undefined4 *)(sVar4 * sVar8 * uVar19 + (long)pvVar6);
              uVar26 = 0;
              do {
                if (0 < (int)uVar25) {
                  uVar16 = uVar19 & 0xffffffff;
                  uVar15 = 0;
                  do {
                    iVar14 = (int)uVar16;
                    uVar21 = (ulong)local_150;
                    if (0 < (int)local_150) {
                      do {
                        *puVar18 = *(undefined4 *)
                                    ((long)local_c8.data +
                                    (long)(int)uVar16 * 4 +
                                    local_c8.cstep *
                                    CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                    * uVar26);
                        puVar18 = puVar18 + 1;
                        uVar16 = (ulong)((int)uVar16 + _c);
                        uVar21 = uVar21 - 1;
                      } while (uVar21 != 0);
                    }
                    uVar15 = uVar15 + 1;
                    uVar16 = (ulong)(iVar14 + local_150 * _c);
                  } while (uVar15 != uVar17);
                }
                uVar26 = uVar26 + 1;
                uVar25 = local_cc;
              } while (uVar26 != local_13c);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != _c);
        }
      }
      else {
        local_138 = 0;
      }
    }
  }
LAB_0021063a:
  Mat::~Mat(&local_c8);
LAB_0021064c:
  piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_118.data != (undefined4 *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_138;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    // resolve out shape

    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    bool need_permute = permute == 1;
    if (dims == 2 && ndim == 2 && bottom_blob.h == outh)
        need_permute = false;
    if (dims == 3 && ndim == 3 && bottom_blob.c == outc)
        need_permute = false;
    if (dims == 4 && ndim == 4 && bottom_blob.c == outc)
        need_permute = false;

    if (need_permute)
    {
        Mat bottom_blob_permuted = bottom_blob;

        if (dims == 2)
        {
            // hw -> wh
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;

            bottom_blob_permuted.create(_h, _w, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = bottom_blob_permuted;

            for (int i = 0; i < _w; i++)
            {
                for (int j = 0; j < _h; j++)
                {
                    *outptr++ = ptr[j * _w + i];
                }
            }
        }
        if (dims == 3)
        {
            // chw -> hwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < _h; q++)
            {
                float* outptr = bottom_blob_permuted.channel(q);

                for (int i = 0; i < _w; i++)
                {
                    for (int j = 0; j < channels; j++)
                    {
                        *outptr++ = bottom_blob.channel(j).row(q)[i];
                    }
                }
            }
        }

        if (dims == 4)
        {
            // cdhw -> dhwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int _d = bottom_blob.d;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, _d, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int z = 0; z < _d; z++)
            {
                float* outptr = bottom_blob_permuted.channel(z);

                for (int q = 0; q < _h; q++)
                {
                    for (int i = 0; i < _w; i++)
                    {
                        for (int j = 0; j < channels; j++)
                        {
                            *outptr++ = bottom_blob.channel(j).depth(z).row(q)[i];
                        }
                    }
                }
            }
        }

        if (ndim == 1)
        {
            top_blob = bottom_blob_permuted.reshape(outw, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        // permute on ndhwc/nhwc/nhc
        Mat top_blob_permuted;
        if (ndim == 2)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outh, outw, opt.workspace_allocator);
        }
        if (ndim == 3)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, opt.workspace_allocator);
        }
        if (ndim == 4)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, outd, opt.workspace_allocator);
        }
        if (top_blob_permuted.empty())
            return -100;

        if (ndim == 2)
        {
            // wh -> hw
            top_blob.create(outw, outh, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = top_blob_permuted;
            float* outptr = top_blob;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    *outptr++ = ptr[j * outh + i];
                }
            }
        }
        if (ndim == 3)
        {
            // hwc -> chw
            top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    const float* ptr = top_blob_permuted.channel(i);

                    for (int j = 0; j < outw; j++)
                    {
                        *outptr++ = ptr[j * outc + q];
                    }
                }
            }
        }
        if (ndim == 4)
        {
            // dhwc -> cdhw
            top_blob.create(outw, outh, outd, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int k = 0; k < outd; k++)
                {
                    const float* ptr = top_blob_permuted.channel(k);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            *outptr++ = ptr[i * outw * outc + j * outc + q];
                        }
                    }
                }
            }
        }

        return 0;
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}